

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

_Bool vec3_line_segments_on_same_line(vec3 ap0,vec3 ap1,vec3 bp0,vec3 bp1,float eps)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  vec3 v1;
  vec3 v2;
  vec3 v2_00;
  undefined4 local_18;
  undefined4 uStack_14;
  
  fVar4 = ap0.z;
  fVar2 = ap0.x;
  fVar3 = ap0.y;
  fVar5 = fVar2 - ap1.x;
  fVar6 = fVar3 - ap1.y;
  fVar7 = fVar4 - ap1.z;
  v2.x = fVar2 - bp0.x;
  v2.y = fVar3 - bp0.y;
  v2.z = fVar4 - bp0.z;
  vVar8.y = fVar6;
  vVar8.x = fVar5;
  vVar8.z = fVar7;
  vVar8 = vec3_cross(vVar8,v2);
  if (eps * eps <= vVar8.z * vVar8.z + vVar8.x * vVar8.x + vVar8.y * vVar8.y) {
    bVar1 = false;
  }
  else {
    local_18 = bp1.x;
    uStack_14 = bp1.y;
    v2_00.x = fVar2 - local_18;
    v2_00.y = fVar3 - uStack_14;
    v2_00.z = fVar4 - bp1.z;
    v1.y = fVar6;
    v1.x = fVar5;
    v1.z = fVar7;
    vVar8 = vec3_cross(v1,v2_00);
    bVar1 = vVar8.z * vVar8.z + vVar8.x * vVar8.x + vVar8.y * vVar8.y < eps * eps;
  }
  return bVar1;
}

Assistant:

bool vec3_line_segments_on_same_line(vec3 ap0, vec3 ap1, vec3 bp0, vec3 bp1, float eps) {
    // Check if triangle ap0, ap1, bp0 and ap0, ap1, bp1 both have area of 0
    vec3 v0 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp0));
    vec3 v1 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp1));
    return vec3_length_squared(v0) < eps*eps && vec3_length_squared(v1) < eps*eps;
}